

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O0

int eia608_to_index(uint16_t cc_data,int *chan,int *c1,int *c2)

{
  ushort uVar1;
  int iVar2;
  int *in_RCX;
  int *in_RDX;
  uint *in_RSI;
  ushort in_DI;
  undefined4 local_4;
  
  *in_RCX = -1;
  *in_RDX = -1;
  *in_RSI = 0;
  uVar1 = in_DI & 0x7f7f;
  iVar2 = eia608_is_basicna(uVar1);
  if (iVar2 == 0) {
    *in_RSI = uVar1 & 0x800;
    uVar1 = in_DI & 0x777f;
    iVar2 = eia608_is_specialna(uVar1);
    if (iVar2 == 0) {
      if ((uVar1 < 0x1220) || (0x123f < uVar1)) {
        if ((uVar1 < 0x1320) || (0x133f < uVar1)) {
          local_4 = 0;
        }
        else {
          *in_RDX = uVar1 - 0x1290;
          local_4 = 1;
        }
      }
      else {
        *in_RDX = uVar1 - 0x11b0;
        local_4 = 1;
      }
    }
    else {
      *in_RDX = uVar1 - 0x10d0;
      local_4 = 1;
    }
  }
  else {
    *in_RDX = ((int)(uint)uVar1 >> 8) + -0x20;
    uVar1 = in_DI & 0x7f;
    if ((uVar1 < 0x20) || (0x7f < uVar1)) {
      local_4 = 1;
    }
    else {
      *in_RCX = uVar1 - 0x20;
      local_4 = 2;
    }
  }
  return local_4;
}

Assistant:

static int eia608_to_index(uint16_t cc_data, int* chan, int* c1, int* c2)
{
    (*c1) = (*c2) = -1;
    (*chan) = 0;
    cc_data &= 0x7F7F; // strip off parity bits

    // Handle Basic NA BEFORE we strip the channel bit
    if (eia608_is_basicna(cc_data)) {
        // we got first char, yes. But what about second char?
        (*c1) = (cc_data >> 8) - 0x20;
        cc_data &= 0x00FF;

        if (0x0020 <= cc_data && 0x0080 > cc_data) {
            (*c2) = cc_data - 0x20;
            return 2;
        }

        return 1;
    }

    // Check then strip second channel toggle
    (*chan) = cc_data & 0x0800;
    cc_data = cc_data & 0xF7FF;

    if (eia608_is_specialna(cc_data)) {
        // Special North American character
        (*c1) = cc_data - 0x1130 + 0x60;
        return 1;
    }

    if (0x1220 <= cc_data && 0x1240 > cc_data) {
        // Extended Western European character set, Spanish/Miscellaneous/French
        (*c1) = cc_data - 0x1220 + 0x70;
        return 1;
    }

    if (0x1320 <= cc_data && 0x1340 > cc_data) {
        // Extended Western European character set, Portuguese/German/Danish
        (*c1) = cc_data - 0x1320 + 0x90;
        return 1;
    }

    return 0;
}